

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyConvertCDATANodes(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = node;
  while (next = pNVar1, next != (Node *)0x0) {
    pNVar1 = next->next;
    if (next->type == CDATATag) {
      next->type = TextNode;
    }
    if (next->content != (Node *)0x0) {
      prvTidyConvertCDATANodes(doc,next->content);
    }
  }
  return;
}

Assistant:

void TY_(ConvertCDATANodes)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->type == CDATATag)
            node->type = TextNode;

        if (node->content)
            TY_(ConvertCDATANodes)(doc, node->content);

        node = next;
    }
}